

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwritedeclaration.cpp
# Opt level: O0

void __thiscall CPP::WriteDeclaration::acceptLayout(WriteDeclaration *this,DomLayout *node)

{
  bool bVar1;
  QTextStream *pQVar2;
  DomLayout *in_RSI;
  Driver *in_RDI;
  long in_FS_OFFSET;
  QString className;
  DomLayout *in_stack_ffffffffffffff78;
  QString *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff90;
  Driver *this_00;
  QString local_50 [2];
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_20.d.size = -0x5555555555555556;
  this_00 = in_RDI;
  Qt::Literals::StringLiterals::operator____s((char16_t *)in_RDI,in_stack_ffffffffffffff90);
  bVar1 = DomLayout::hasAttributeClass(in_RSI);
  if (bVar1) {
    DomLayout::attributeClass(in_stack_ffffffffffffff78);
    QString::operator=(in_stack_ffffffffffffff80,&in_stack_ffffffffffffff78->m_attr_class);
    QString::~QString((QString *)0x119a32);
  }
  pQVar2 = (QTextStream *)
           QTextStream::operator<<
                     ((QTextStream *)(in_RDI->m_option).inputFile.d.ptr,
                      (QString *)((in_RDI->m_option).inputFile.d.size + 0x50));
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,&local_20);
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2," *");
  Driver::findOrInsertLayout(this_00,in_RSI);
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,local_50);
  QTextStream::operator<<(pQVar2,";\n");
  QString::~QString((QString *)0x119ab6);
  TreeWalker::acceptLayout((TreeWalker *)this_00,in_RSI);
  QString::~QString((QString *)0x119acf);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void WriteDeclaration::acceptLayout(DomLayout *node)
{
    QString className = u"QLayout"_s;
    if (node->hasAttributeClass())
        className = node->attributeClass();

    m_output << m_option.indent << className << " *" << m_driver->findOrInsertLayout(node) << ";\n";

    TreeWalker::acceptLayout(node);
}